

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyDecodingSynapse.cpp
# Opt level: O3

void __thiscall LatencyDecodingSynapse::update(LatencyDecodingSynapse *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  Event *pEVar5;
  Population *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer ppEVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  _func_int **pp_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  dVar1 = this->currentWindow;
  dVar2 = this->param->window_length_s;
  dVar14 = Clock::getCurrentTime(this->clock);
  if (dVar1 + dVar2 <= dVar14) {
    uVar13 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if ((long)uVar13 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    pdVar3 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    if (1 < uVar13) {
      uVar11 = 0;
      do {
        pdVar3[uVar11] = -1.0;
        (pdVar3 + uVar11)[1] = -1.0;
        uVar11 = uVar11 + 2;
      } while (uVar11 < (uVar13 & 0x7ffffffffffffffe));
    }
    auVar8 = _DAT_0010c050;
    auVar7 = _DAT_0010c040;
    if ((long)(uVar13 & 0x7ffffffffffffffe) < (long)uVar13) {
      uVar10 = (uint)uVar13 & 1;
      lVar12 = (ulong)uVar10 - 1;
      auVar16._8_4_ = (int)lVar12;
      auVar16._0_8_ = lVar12;
      auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar11 = 0;
      auVar16 = auVar16 ^ _DAT_0010c050;
      do {
        auVar17._8_4_ = (int)uVar11;
        auVar17._0_8_ = uVar11;
        auVar17._12_4_ = (int)(uVar11 >> 0x20);
        auVar17 = (auVar17 | auVar7) ^ auVar8;
        if ((bool)(~(auVar17._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar17._0_4_ ||
                    auVar16._4_4_ < auVar17._4_4_) & 1)) {
          pdVar3[(uVar13 & 0xfffffffffffffffe) + uVar11] = -1.0;
        }
        if ((auVar17._12_4_ != auVar16._12_4_ || auVar17._8_4_ <= auVar16._8_4_) &&
            auVar17._12_4_ <= auVar16._12_4_) {
          pdVar3[(uVar13 & 0xfffffffffffffffe) + uVar11 + 1] = -1.0;
        }
        uVar11 = uVar11 + 2;
      } while ((uVar10 + 1 & 0xfffffffe) != uVar11);
    }
    this->currentWindow = this->param->window_length_s + this->currentWindow;
  }
  if (0 < this->inputSize) {
    uVar13 = 0;
    do {
      if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= (long)uVar13) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x1a9,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar4 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pdVar3 = pdVar4 + uVar13;
      if (0.0 < *pdVar3 || *pdVar3 == 0.0) {
        ppEVar9 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        ppEVar9 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar5 = (((this->super_Synapse).from_population)->output).
                 super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13];
        if (pEVar5->type == Spike) {
          pp_Var15 = (_func_int **)
                     (((pEVar5->eventTime - this->currentWindow) / this->param->window_length_s +
                      -0.1) * 1.25);
          pdVar4[uVar13] = (double)pp_Var15;
          ppEVar9[uVar13][1]._vptr_Event = pp_Var15;
        }
      }
      pPVar6 = (this->super_Synapse).to_population;
      (*pPVar6->_vptr_Population[5])(pPVar6,uVar13 & 0xffffffff,ppEVar9[uVar13]);
      Logging::logValue(this->logger,(long)this,(int)uVar13,3,
                        (double)(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13][1]._vptr_Event);
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)this->inputSize);
  }
  return;
}

Assistant:

void LatencyDecodingSynapse::update() {
    if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
        spikeTimes.setConstant(-1);
        currentWindow += param->window_length_s;
    }
    for(int i = 0; i < inputSize; i++) {
        if(spikeTimes(i) < 0 && from_population->output[i]->type == EventType::Spike) {      
            double s0 = from_population->output[i]->eventTime - currentWindow;
            s0 = s0/param->window_length_s;
            spikeTimes(i) = (s0 - 0.1) * 1.25;
            static_cast<ValueEvent*>(output[i])->setValue(spikeTimes(i));
            
        }
        to_population->setInput(i, output[i]);
        logger->logValue((long)this, i, EventType::Value, static_cast<ValueEvent*>(output[i])->value);
    }
}